

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O2

int coda_ascbin_cursor_goto_next_record_field(coda_cursor *cursor)

{
  long lVar1;
  coda_expression *expr;
  int iVar2;
  int iVar3;
  coda_dynamic_type *pcVar4;
  long lVar5;
  long lVar6;
  coda_type *pcVar7;
  int available;
  long local_350;
  long available_index;
  coda_cursor record_cursor;
  
  available = 1;
  lVar5 = (long)cursor->n;
  pcVar7 = (coda_type *)cursor->stack[lVar5 + -2].type;
  if (99 < pcVar7->format) {
    pcVar7 = *(coda_type **)&pcVar7->type_class;
  }
  lVar6 = cursor->stack[lVar5 + -1].index;
  lVar1 = lVar6 + 1;
  if ((lVar6 < -1) || ((long)pcVar7[1].name <= lVar1)) {
    coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld)",lVar1);
    return -1;
  }
  lVar5 = cursor->stack[lVar5 + -2].bit_offset;
  if (pcVar7[1].attributes == (coda_type_record *)0x0) {
    iVar2 = get_next_relative_field_bit_offset(cursor,&available_index,(int64_t *)0x0);
    if (iVar2 != 0) {
      return -1;
    }
    local_350 = lVar5 + available_index;
    expr = *(coda_expression **)(*(long *)(pcVar7[1].description + lVar6 * 8 + 8) + 0x20);
    if (expr != (coda_expression *)0x0) {
      memcpy(&record_cursor,cursor,0x310);
      record_cursor.n = record_cursor.n + -1;
      iVar3 = coda_expression_eval_bool(expr,&record_cursor,&available);
      iVar2 = available;
      if (iVar3 != 0) {
        coda_add_error_message(" for available expression");
        coda_cursor_add_to_error_message(cursor);
        return -1;
      }
      goto LAB_0017a7ee;
    }
  }
  else {
    local_350 = lVar5;
    memcpy(&record_cursor,cursor,0x310);
    record_cursor.n = record_cursor.n + -1;
    iVar2 = coda_cursor_get_available_union_field_index(&record_cursor,&available_index);
    if (iVar2 != 0) {
      return -1;
    }
    if (lVar1 != available_index) {
      available = 0;
      iVar2 = 0;
      goto LAB_0017a7ee;
    }
  }
  iVar2 = 1;
LAB_0017a7ee:
  lVar5 = local_350;
  if (iVar2 == 0) {
    pcVar4 = coda_no_data_singleton(pcVar7->format);
  }
  else {
    pcVar4 = *(coda_dynamic_type **)(*(long *)(pcVar7[1].description + lVar6 * 8 + 8) + 0x10);
  }
  lVar6 = (long)cursor->n;
  cursor->stack[lVar6 + -1].type = pcVar4;
  cursor->stack[lVar6 + -1].index = lVar1;
  cursor->stack[lVar6 + -1].bit_offset = lVar5;
  return 0;
}

Assistant:

int coda_ascbin_cursor_goto_next_record_field(coda_cursor *cursor)
{
    coda_type_record *record;
    int64_t bit_offset;
    int available = 1;
    long index;

    record = (coda_type_record *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 2].type);
    index = cursor->stack[cursor->n - 1].index + 1;
    if (index < 0 || index >= record->num_fields)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld)", index,
                       record->num_fields);
        return -1;
    }

    bit_offset = cursor->stack[cursor->n - 2].bit_offset;
    if (record->union_field_expr != NULL)
    {
        coda_cursor record_cursor = *cursor;
        long available_index;

        record_cursor.n--;
        if (coda_cursor_get_available_union_field_index(&record_cursor, &available_index) != 0)
        {
            return -1;
        }
        if (index != available_index)
        {
            available = 0;
        }
    }
    else
    {
        int64_t rel_bit_offset;

        if (get_next_relative_field_bit_offset(cursor, &rel_bit_offset, NULL) != 0)
        {
            return -1;
        }
        bit_offset += rel_bit_offset;
        if (record->field[index]->available_expr != NULL)
        {
            coda_cursor record_cursor = *cursor;

            record_cursor.n--;
            if (coda_expression_eval_bool(record->field[index]->available_expr, &record_cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
        }
    }
    if (available)
    {
        cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)record->field[index]->type;
    }
    else
    {
        cursor->stack[cursor->n - 1].type = coda_no_data_singleton(record->format);
    }
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = bit_offset;

    return 0;
}